

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.h
# Opt level: O2

QNativeIpcKeyPrivate * QNativeIpcKeyPrivate::makeExtended(QNativeIpcKey *key)

{
  QNativeIpcKeyPrivate *pQVar1;
  
  if (key->d != (QNativeIpcKeyPrivate *)0x0) {
    return key->d;
  }
  pQVar1 = (QNativeIpcKeyPrivate *)operator_new(0x18);
  (pQVar1->legacyKey_).d.d = (Data *)0x0;
  (pQVar1->legacyKey_).d.ptr = (char16_t *)0x0;
  (pQVar1->legacyKey_).d.size = 0;
  key->d = pQVar1;
  return pQVar1;
}

Assistant:

constexpr bool isSlowPath() const noexcept
    { return Q_UNLIKELY(d); }